

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void reg_reg12_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  ushort uVar1;
  m680x_insn mVar2;
  long lVar3;
  byte bVar4;
  
  uVar1 = *address;
  *address = uVar1 + 1;
  lVar3 = (ulong)uVar1 - (ulong)info->offset;
  if ((uint)lVar3 < info->size) {
    bVar4 = info->code[lVar3];
    mVar2 = M680X_INS_EXG;
    if (-1 < (char)bVar4) {
      mVar2 = M680X_INS_TFR;
    }
  }
  else {
    mVar2 = M680X_INS_TFR;
    bVar4 = 0;
  }
  info->insn = mVar2;
  add_reg_operand(info,reg_reg12_hdlr::g_tfr_exg12_reg0_ids[bVar4 >> 4 & 7]);
  add_reg_operand(info,reg_reg12_hdlr::g_tfr_exg12_reg1_ids[bVar4 & 7]);
  return;
}

Assistant:

static void reg_reg12_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg g_tfr_exg12_reg0_ids[] = {
		M680X_REG_A, M680X_REG_B,  M680X_REG_CC,  M680X_REG_TMP3,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y,  M680X_REG_S,
	};
	static const m680x_reg g_tfr_exg12_reg1_ids[] = {
		M680X_REG_A, M680X_REG_B,  M680X_REG_CC,  M680X_REG_TMP2,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y,  M680X_REG_S,
	};
	uint8_t regs = 0;

	read_byte(info, &regs, (*address)++);

	// The opcode of this instruction depends on
	// the msb of its post byte.
	if (regs & 0x80)
		info->insn = M680X_INS_EXG;
	else
		info->insn = M680X_INS_TFR;

	add_reg_operand(info, g_tfr_exg12_reg0_ids[(regs >> 4) & 0x07]);
	add_reg_operand(info, g_tfr_exg12_reg1_ids[regs & 0x07]);
}